

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

int cmcmd_cmake_ninja_depends(const_iterator argBeg,const_iterator argEnd)

{
  size_t *this;
  bool bVar1;
  byte bVar2;
  _Ios_Openmode _Var3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  char *m3;
  pointer this_00;
  ostream *poVar7;
  Value *pVVar8;
  reference pbVar9;
  size_type sVar10;
  const_iterator cVar11;
  undefined1 local_d98 [8];
  cmGeneratedFileStream ddif;
  _Self local_b28;
  _Self local_b20;
  iterator i_3;
  Value *ddi_requires;
  _Self local_ac0;
  _Self local_ab8;
  iterator i_2;
  Value *ddi_provides;
  undefined1 local_a58 [8];
  Value ddi;
  _Self local_a10;
  _Self local_a08;
  iterator i_1;
  undefined1 local_9e0 [8];
  cmGeneratedFileStream depfile;
  cmFortranParser parser;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defines;
  cmFortranSourceInfo info;
  SelfType local_540;
  _Base_ptr local_530;
  undefined1 local_528;
  undefined1 local_520 [8];
  const_iterator i;
  Value *tdi_include_dirs;
  undefined1 local_4e8 [8];
  Reader reader;
  ifstream tdif;
  Value *tdi;
  Value tdio;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  string *arg;
  const_iterator a;
  string arg_ddi;
  string arg_obj;
  string arg_dep;
  string arg_pp;
  string arg_tdi;
  const_iterator argEnd_local;
  const_iterator argBeg_local;
  
  arg_tdi.field_2._8_8_ = argEnd._M_current;
  std::__cxx11::string::string((string *)(arg_pp.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(arg_dep.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(arg_obj.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(arg_ddi.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&a);
  arg = argBeg._M_current;
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&arg,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&arg_tdi.field_2 + 8));
    if (!bVar1) {
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          uVar5 = std::__cxx11::string::empty();
          if ((uVar5 & 1) == 0) {
            uVar5 = std::__cxx11::string::empty();
            if ((uVar5 & 1) == 0) {
              uVar5 = std::__cxx11::string::empty();
              if ((uVar5 & 1) == 0) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&tdio.limit_);
                Json::Value::Value((Value *)&tdi,nullValue);
                pcVar6 = (char *)std::__cxx11::string::c_str();
                _Var3 = std::operator|(_S_in,_S_bin);
                std::ifstream::ifstream(&reader.features_,pcVar6,_Var3);
                Json::Reader::Reader((Reader *)local_4e8);
                bVar1 = Json::Reader::parse((Reader *)local_4e8,(istream *)&reader.features_,
                                            (Value *)&tdi,false);
                if (!bVar1) {
                  pcVar6 = (char *)std::__cxx11::string::c_str();
                  Json::Reader::getFormattedErrorMessages_abi_cxx11_
                            ((string *)&tdi_include_dirs,(Reader *)local_4e8);
                  m3 = (char *)std::__cxx11::string::c_str();
                  cmSystemTools::Error
                            ("-E cmake_ninja_depends failed to parse ",pcVar6,m3,(char *)0x0);
                  std::__cxx11::string::~string((string *)&tdi_include_dirs);
                  argBeg_local._M_current._4_4_ = 1;
                }
                bVar1 = !bVar1;
                Json::Reader::~Reader((Reader *)local_4e8);
                std::ifstream::~ifstream(&reader.features_);
                if (!bVar1) {
                  i.super_ValueIteratorBase._8_8_ =
                       Json::Value::operator[]((Value *)&tdi,"include-dirs");
                  bVar1 = Json::Value::isArray((Value *)i.super_ValueIteratorBase._8_8_);
                  if (bVar1) {
                    cVar11 = Json::Value::begin((Value *)i.super_ValueIteratorBase._8_8_);
                    local_530 = (_Base_ptr)cVar11.super_ValueIteratorBase.current_._M_node;
                    local_528 = cVar11.super_ValueIteratorBase.isNull_;
                    local_520 = (undefined1  [8])local_530;
                    i.super_ValueIteratorBase.current_._M_node._0_1_ = local_528;
                    while( true ) {
                      cVar11 = Json::Value::end((Value *)i.super_ValueIteratorBase._8_8_);
                      local_540.current_ = cVar11.super_ValueIteratorBase.current_._M_node;
                      local_540.isNull_ = cVar11.super_ValueIteratorBase.isNull_;
                      bVar1 = Json::ValueIteratorBase::operator!=
                                        ((ValueIteratorBase *)local_520,&local_540);
                      if (!bVar1) break;
                      this_00 = Json::ValueConstIterator::operator->
                                          ((ValueConstIterator *)local_520);
                      Json::Value::asString_abi_cxx11_
                                ((string *)
                                 &info.Includes._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                 this_00);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&tdio.limit_,
                                  (value_type *)
                                  &info.Includes._M_t._M_impl.super__Rb_tree_header._M_node_count);
                      std::__cxx11::string::~string
                                ((string *)
                                 &info.Includes._M_t._M_impl.super__Rb_tree_header._M_node_count);
                      Json::ValueConstIterator::operator++((ValueConstIterator *)local_520);
                    }
                  }
                  bVar1 = false;
                }
                Json::Value::~Value((Value *)&tdi);
                if (!bVar1) {
                  this = &defines._M_t._M_impl.super__Rb_tree_header._M_node_count;
                  cmFortranSourceInfo::cmFortranSourceInfo((cmFortranSourceInfo *)this);
                  std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&parser.Info);
                  cmFortranParser_s::cmFortranParser_s
                            ((cmFortranParser_s *)&depfile.field_0x240,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&tdio.limit_,
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&parser.Info,(cmFortranSourceInfo *)this);
                  pcVar6 = (char *)std::__cxx11::string::c_str();
                  bVar1 = cmFortranParser_FilePush((cmFortranParser *)&depfile.field_0x240,pcVar6);
                  if (bVar1) {
                    iVar4 = cmFortran_yyparse(parser.IncludePath.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    if (iVar4 == 0) {
                      pcVar6 = (char *)std::__cxx11::string::c_str();
                      cmGeneratedFileStream::cmGeneratedFileStream
                                ((cmGeneratedFileStream *)local_9e0,pcVar6,false,None);
                      cmsys::SystemTools::ConvertToUnixOutputPath
                                ((string *)&i_1,(string *)((long)&arg_dep.field_2 + 8));
                      poVar7 = std::operator<<((ostream *)local_9e0,(string *)&i_1);
                      std::operator<<(poVar7,":");
                      std::__cxx11::string::~string((string *)&i_1);
                      local_a08._M_node =
                           (_Base_ptr)
                           std::
                           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&info.Requires._M_t._M_impl.super__Rb_tree_header.
                                       _M_node_count);
                      while( true ) {
                        local_a10._M_node =
                             (_Base_ptr)
                             std::
                             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&info.Requires._M_t._M_impl.super__Rb_tree_header.
                                       _M_node_count);
                        bVar1 = std::operator!=(&local_a08,&local_a10);
                        if (!bVar1) break;
                        poVar7 = std::operator<<((ostream *)local_9e0," \\\n ");
                        pbVar9 = std::
                                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ::operator*(&local_a08);
                        cmsys::SystemTools::ConvertToUnixOutputPath((string *)&ddi.limit_,pbVar9);
                        std::operator<<(poVar7,(string *)&ddi.limit_);
                        std::__cxx11::string::~string((string *)&ddi.limit_);
                        std::
                        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator++(&local_a08);
                      }
                      std::operator<<((ostream *)local_9e0,"\n");
                      cmGeneratedFileStream::~cmGeneratedFileStream
                                ((cmGeneratedFileStream *)local_9e0);
                      Json::Value::Value((Value *)local_a58,objectValue);
                      Json::Value::Value((Value *)&ddi_provides,
                                         (string *)((long)&arg_ddi.field_2 + 8));
                      pVVar8 = Json::Value::operator[]((Value *)local_a58,"object");
                      Json::Value::operator=(pVVar8,(Value *)&ddi_provides);
                      Json::Value::~Value((Value *)&ddi_provides);
                      Json::Value::Value((Value *)&i_2,arrayValue);
                      pVVar8 = Json::Value::operator[]((Value *)local_a58,"provides");
                      pVVar8 = Json::Value::operator=(pVVar8,(Value *)&i_2);
                      Json::Value::~Value((Value *)&i_2);
                      local_ab8._M_node =
                           (_Base_ptr)
                           std::
                           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)((long)&info.Source.field_2 + 8));
                      while( true ) {
                        local_ac0._M_node =
                             (_Base_ptr)
                             std::
                             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)((long)&info.Source.field_2 + 8));
                        bVar1 = std::operator!=(&local_ab8,&local_ac0);
                        if (!bVar1) break;
                        pbVar9 = std::
                                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ::operator*(&local_ab8);
                        Json::Value::Value((Value *)&ddi_requires,pbVar9);
                        Json::Value::append(pVVar8,(Value *)&ddi_requires);
                        Json::Value::~Value((Value *)&ddi_requires);
                        std::
                        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator++(&local_ab8);
                      }
                      Json::Value::Value((Value *)&i_3,arrayValue);
                      pVVar8 = Json::Value::operator[]((Value *)local_a58,"requires");
                      pVVar8 = Json::Value::operator=(pVVar8,(Value *)&i_3);
                      Json::Value::~Value((Value *)&i_3);
                      local_b20._M_node =
                           (_Base_ptr)
                           std::
                           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&info.Provides._M_t._M_impl.super__Rb_tree_header.
                                       _M_node_count);
                      while( true ) {
                        local_b28._M_node =
                             (_Base_ptr)
                             std::
                             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&info.Provides._M_t._M_impl.super__Rb_tree_header.
                                       _M_node_count);
                        bVar1 = std::operator!=(&local_b20,&local_b28);
                        if (!bVar1) break;
                        pbVar9 = std::
                                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ::operator*(&local_b20);
                        sVar10 = std::
                                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)((long)&info.Source.field_2 + 8),pbVar9);
                        if (sVar10 == 0) {
                          pbVar9 = std::
                                   _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   ::operator*(&local_b20);
                          Json::Value::Value((Value *)&ddif.field_0x240,pbVar9);
                          Json::Value::append(pVVar8,(Value *)&ddif.field_0x240);
                          Json::Value::~Value((Value *)&ddif.field_0x240);
                        }
                        std::
                        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator++(&local_b20);
                      }
                      pcVar6 = (char *)std::__cxx11::string::c_str();
                      cmGeneratedFileStream::cmGeneratedFileStream
                                ((cmGeneratedFileStream *)local_d98,pcVar6,false,None);
                      Json::operator<<((ostream *)local_d98,(Value *)local_a58);
                      bVar2 = std::ios::operator!((ios *)(local_d98 +
                                                         (long)*(_func_int **)
                                                                ((long)local_d98 + -0x18)));
                      argBeg_local._M_current._4_1_ = (bVar2 & 1) != 0;
                      if (argBeg_local._M_current._4_1_) {
                        pcVar6 = (char *)std::__cxx11::string::c_str();
                        cmSystemTools::Error
                                  ("-E cmake_ninja_depends failed to write ",pcVar6,(char *)0x0,
                                   (char *)0x0);
                      }
                      argBeg_local._M_current._5_3_ = 0;
                      cmGeneratedFileStream::~cmGeneratedFileStream
                                ((cmGeneratedFileStream *)local_d98);
                      Json::Value::~Value((Value *)local_a58);
                    }
                    else {
                      argBeg_local._M_current._4_4_ = 1;
                    }
                  }
                  else {
                    pcVar6 = (char *)std::__cxx11::string::c_str();
                    cmSystemTools::Error
                              ("-E cmake_ninja_depends failed to open ",pcVar6,(char *)0x0,
                               (char *)0x0);
                    argBeg_local._M_current._4_4_ = 1;
                  }
                  cmFortranParser_s::~cmFortranParser_s((cmFortranParser_s *)&depfile.field_0x240);
                  std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&parser.Info);
                  cmFortranSourceInfo::~cmFortranSourceInfo
                            ((cmFortranSourceInfo *)
                             &defines._M_t._M_impl.super__Rb_tree_header._M_node_count);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&tdio.limit_);
              }
              else {
                cmSystemTools::Error
                          ("-E cmake_ninja_depends requires value for --ddi=",(char *)0x0,
                           (char *)0x0,(char *)0x0);
                argBeg_local._M_current._4_4_ = 1;
              }
            }
            else {
              cmSystemTools::Error
                        ("-E cmake_ninja_depends requires value for --obj=",(char *)0x0,(char *)0x0,
                         (char *)0x0);
              argBeg_local._M_current._4_4_ = 1;
            }
          }
          else {
            cmSystemTools::Error
                      ("-E cmake_ninja_depends requires value for --dep=",(char *)0x0,(char *)0x0,
                       (char *)0x0);
            argBeg_local._M_current._4_4_ = 1;
          }
        }
        else {
          cmSystemTools::Error
                    ("-E cmake_ninja_depends requires value for --pp=",(char *)0x0,(char *)0x0,
                     (char *)0x0);
          argBeg_local._M_current._4_4_ = 1;
        }
      }
      else {
        cmSystemTools::Error
                  ("-E cmake_ninja_depends requires value for --tdi=",(char *)0x0,(char *)0x0,
                   (char *)0x0);
        argBeg_local._M_current._4_4_ = 1;
      }
LAB_00812c74:
      std::__cxx11::string::~string((string *)&a);
      std::__cxx11::string::~string((string *)(arg_ddi.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(arg_obj.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(arg_dep.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(arg_pp.field_2._M_local_buf + 8));
      return argBeg_local._M_current._4_4_;
    }
    local_d0 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&arg);
    bVar1 = cmHasLiteralPrefix<std::__cxx11::string,7ul>(local_d0,(char (*) [7])0xbbf65a);
    if (bVar1) {
      std::__cxx11::string::substr((ulong)local_100,(ulong)local_d0);
      std::__cxx11::string::operator=((string *)(arg_pp.field_2._M_local_buf + 8),local_100);
      std::__cxx11::string::~string(local_100);
    }
    else {
      bVar1 = cmHasLiteralPrefix<std::__cxx11::string,6ul>(local_d0,(char (*) [6])0xbbedc0);
      if (bVar1) {
        std::__cxx11::string::substr((ulong)local_120,(ulong)local_d0);
        std::__cxx11::string::operator=((string *)(arg_dep.field_2._M_local_buf + 8),local_120);
        std::__cxx11::string::~string(local_120);
      }
      else {
        bVar1 = cmHasLiteralPrefix<std::__cxx11::string,7ul>(local_d0,(char (*) [7])0xbbedf0);
        if (bVar1) {
          std::__cxx11::string::substr((ulong)local_140,(ulong)local_d0);
          std::__cxx11::string::operator=((string *)(arg_obj.field_2._M_local_buf + 8),local_140);
          std::__cxx11::string::~string(local_140);
        }
        else {
          bVar1 = cmHasLiteralPrefix<std::__cxx11::string,7ul>(local_d0,(char (*) [7])0xbbee21);
          if (bVar1) {
            std::__cxx11::string::substr((ulong)local_160,(ulong)local_d0);
            std::__cxx11::string::operator=((string *)(arg_ddi.field_2._M_local_buf + 8),local_160);
            std::__cxx11::string::~string(local_160);
          }
          else {
            bVar1 = cmHasLiteralPrefix<std::__cxx11::string,7ul>(local_d0,(char (*) [7])0xbbee52);
            if (!bVar1) {
              pcVar6 = (char *)std::__cxx11::string::c_str();
              cmSystemTools::Error
                        ("-E cmake_ninja_depends unknown argument: ",pcVar6,(char *)0x0,(char *)0x0)
              ;
              argBeg_local._M_current._4_4_ = 1;
              goto LAB_00812c74;
            }
            std::__cxx11::string::substr((ulong)local_180,(ulong)local_d0);
            std::__cxx11::string::operator=((string *)&a,local_180);
            std::__cxx11::string::~string(local_180);
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&arg);
  } while( true );
}

Assistant:

int cmcmd_cmake_ninja_depends(std::vector<std::string>::const_iterator argBeg,
                              std::vector<std::string>::const_iterator argEnd)
{
  std::string arg_tdi;
  std::string arg_pp;
  std::string arg_dep;
  std::string arg_obj;
  std::string arg_ddi;
  for (std::vector<std::string>::const_iterator a = argBeg; a != argEnd; ++a) {
    std::string const& arg = *a;
    if (cmHasLiteralPrefix(arg, "--tdi=")) {
      arg_tdi = arg.substr(6);
    } else if (cmHasLiteralPrefix(arg, "--pp=")) {
      arg_pp = arg.substr(5);
    } else if (cmHasLiteralPrefix(arg, "--dep=")) {
      arg_dep = arg.substr(6);
    } else if (cmHasLiteralPrefix(arg, "--obj=")) {
      arg_obj = arg.substr(6);
    } else if (cmHasLiteralPrefix(arg, "--ddi=")) {
      arg_ddi = arg.substr(6);
    } else {
      cmSystemTools::Error("-E cmake_ninja_depends unknown argument: ",
                           arg.c_str());
      return 1;
    }
  }
  if (arg_tdi.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --tdi=");
    return 1;
  }
  if (arg_pp.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --pp=");
    return 1;
  }
  if (arg_dep.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --dep=");
    return 1;
  }
  if (arg_obj.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --obj=");
    return 1;
  }
  if (arg_ddi.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --ddi=");
    return 1;
  }

  std::vector<std::string> includes;
  {
    Json::Value tdio;
    Json::Value const& tdi = tdio;
    {
      cmsys::ifstream tdif(arg_tdi.c_str(), std::ios::in | std::ios::binary);
      Json::Reader reader;
      if (!reader.parse(tdif, tdio, false)) {
        cmSystemTools::Error("-E cmake_ninja_depends failed to parse ",
                             arg_tdi.c_str(),
                             reader.getFormattedErrorMessages().c_str());
        return 1;
      }
    }

    Json::Value const& tdi_include_dirs = tdi["include-dirs"];
    if (tdi_include_dirs.isArray()) {
      for (Json::Value::const_iterator i = tdi_include_dirs.begin();
           i != tdi_include_dirs.end(); ++i) {
        includes.push_back(i->asString());
      }
    }
  }

  cmFortranSourceInfo info;
  std::set<std::string> defines;
  cmFortranParser parser(includes, defines, info);
  if (!cmFortranParser_FilePush(&parser, arg_pp.c_str())) {
    cmSystemTools::Error("-E cmake_ninja_depends failed to open ",
                         arg_pp.c_str());
    return 1;
  }
  if (cmFortran_yyparse(parser.Scanner) != 0) {
    // Failed to parse the file.
    return 1;
  }

  {
    cmGeneratedFileStream depfile(arg_dep.c_str());
    depfile << cmSystemTools::ConvertToUnixOutputPath(arg_pp) << ":";
    for (std::set<std::string>::iterator i = info.Includes.begin();
         i != info.Includes.end(); ++i) {
      depfile << " \\\n " << cmSystemTools::ConvertToUnixOutputPath(*i);
    }
    depfile << "\n";
  }

  Json::Value ddi(Json::objectValue);
  ddi["object"] = arg_obj;

  Json::Value& ddi_provides = ddi["provides"] = Json::arrayValue;
  for (std::set<std::string>::iterator i = info.Provides.begin();
       i != info.Provides.end(); ++i) {
    ddi_provides.append(*i);
  }
  Json::Value& ddi_requires = ddi["requires"] = Json::arrayValue;
  for (std::set<std::string>::iterator i = info.Requires.begin();
       i != info.Requires.end(); ++i) {
    // Require modules not provided in the same source.
    if (!info.Provides.count(*i)) {
      ddi_requires.append(*i);
    }
  }

  cmGeneratedFileStream ddif(arg_ddi.c_str());
  ddif << ddi;
  if (!ddif) {
    cmSystemTools::Error("-E cmake_ninja_depends failed to write ",
                         arg_ddi.c_str());
    return 1;
  }
  return 0;
}